

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O0

BOOLEAN GetFirstBitSet(DWORD *Index,UnitWord64 Mask)

{
  uchar uVar1;
  UnitWord64 Mask_local;
  DWORD *Index_local;
  
  uVar1 = BitScanForward64(Index,Mask);
  return uVar1;
}

Assistant:

inline BOOLEAN
GetFirstBitSet(DWORD *Index, UnitWord64 Mask)
{
#if defined(TARGET_64)
    return _BitScanForward64(Index, Mask);
#else
    //_BitScanForward64 intrinsic is not available in x86 & ARM
    if (_BitScanForward(Index, (UnitWord32)Mask))
    {
        return true;
    }

    if(_BitScanForward(Index, (UnitWord32) (Mask >> 32)))
    {
        *Index = *Index + 32;
        return true;
    }
    return false;
#endif
}